

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_const*>,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Eq,std::allocator<void_const*>>
::raw_hash_set<char_const*const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_const*>,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Eq,std::allocator<void_const*>>
           *this,char **first,char **last,size_t bucket_count,hasher *hash,key_equal *eq,
          allocator_type *alloc)

{
  long lVar1;
  char **key;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_const*>,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Eq,std::allocator<void_const*>>
  *local_48;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>::iterator,_bool>
  local_40;
  
  if (bucket_count == 0) {
    lVar1 = (long)last - (long)first >> 3;
    bucket_count = (lVar1 + -1) / 7 + lVar1;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
  ::raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                  *)this,bucket_count,hash,eq,alloc);
  if (first != last) {
    do {
      local_48 = this;
      EmplaceDecomposable::operator()(&local_40,&local_48,first,first);
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

raw_hash_set(InputIter first, InputIter last, size_t bucket_count = 0,
               const hasher& hash = hasher(), const key_equal& eq = key_equal(),
               const allocator_type& alloc = allocator_type())
      : raw_hash_set(SelectBucketCountForIterRange(first, last, bucket_count),
                     hash, eq, alloc) {
    insert(first, last);
  }